

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

int __thiscall Bitmap::drawText(Bitmap *this,int32_t x,int32_t y,char *text)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int32_t pixel;
  uint uVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  GlyphIterator *this_00;
  
  if (this->font == (GFXfont *)0x0) {
    iVar7 = -1;
  }
  else {
    bVar1 = *text;
    if (bVar1 == 0) {
      iVar7 = 0;
    }
    else {
      iVar7 = 0;
      do {
        iVar3 = Utf8Decoder::decode(&this->utf8,(uint)bVar1);
        if (0 < iVar3) {
          pixel = getPixelIndex(this,x,y);
          uVar4 = GlyphIterator::init(this->glyphIterator,(EVP_PKEY_CTX *)this->font);
          while ((char)uVar4 != '\0') {
            this_00 = this->glyphIterator;
            uVar4 = getPixelIndex(this,pixel,this_00->xOffset,this_00->yOffset);
            if ((-1 < (int)uVar4) && (uVar4 < (uint)this->length)) {
              bVar5 = (byte)uVar4 & 7;
              bVar1 = this->data[uVar4 >> 3];
              bVar6 = (byte)(-0x81 >> bVar5) & bVar1;
              if (this_00->value != false) {
                bVar6 = (byte)(0x80 >> bVar5) | bVar1;
              }
              this->data[uVar4 >> 3] = bVar6;
              this_00 = this->glyphIterator;
            }
            bVar2 = GlyphIterator::next(this_00);
            uVar4 = (uint)bVar2;
          }
          iVar3 = this->glyphIterator->xAdvance;
          x = x + iVar3;
          iVar7 = iVar7 + iVar3;
        }
        text = (char *)((byte *)text + 1);
        bVar1 = *text;
      } while (bVar1 != 0);
    }
  }
  return iVar7;
}

Assistant:

int Bitmap::drawText(const int32_t x, const int32_t y, const char * text)
{
   int32_t cursor;
   int32_t pixel;
   int32_t width;
   int character;
   bool status;

   if (this->font == nullptr)
   {
      return -1;
   }

   width = 0;
   cursor = x;
   while ((character = (uint8_t)(*text++)) != 0)
   {
      //handle utf8 characters
      character = utf8.decode(character);
      //only for ASCII chars in range 1 ..127 and the suported UTF8 onces. Others will be skipped!
      if (character > 0)
      {
         //draw pixel for pixel of character
         const int32_t origin = getPixelIndex(cursor, y);
         status = glyphIterator->init(this->font, character);
         while (status)
         {
            //calculate pixel index to be set to the respective value
            pixel = getPixelIndex(origin, glyphIterator->xOffset, glyphIterator->yOffset);
            if (pixel >= 0)
            {
               //set pixel to its value
               setPixelValue(pixel, glyphIterator->value);
            }
            //select next pixel
            status = glyphIterator->next();
         }

         //increment cursor
         cursor += glyphIterator->xAdvance;
         width += glyphIterator->xAdvance;
      }
   }

   return width;
}